

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall aeron::archive::Context::Context(Context *this)

{
  Context *this_local;
  
  Configuration::Configuration(&this->cfg_);
  std::__cxx11::string::string((string *)&this->aeronDirectoryName_);
  std::shared_ptr<aeron::Context>::shared_ptr(&this->aeronContext_);
  std::shared_ptr<aeron::Aeron>::shared_ptr(&this->aeron_);
  std::__cxx11::string::string((string *)&this->controlRequestChannel_);
  controlRequestChannel(this,&(this->cfg_).controlChannel);
  return;
}

Assistant:

Context::Context() { controlRequestChannel(cfg_.controlChannel); }